

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generator.cc
# Opt level: O2

shared_ptr<kratos::Stmt> __thiscall
kratos::Generator::wire_ports
          (Generator *this,shared_ptr<kratos::Port> *port1,shared_ptr<kratos::Port> *port2)

{
  element_type *peVar1;
  element_type *peVar2;
  pair<bool,_bool> pVar3;
  VarException *this_00;
  __shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2> *in_RCX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  shared_ptr<kratos::Stmt> sVar4;
  basic_string_view<char> bVar5;
  string_view format_str;
  format_args args;
  initializer_list<const_kratos::IRNode_*> __l;
  element_type *local_d8;
  element_type *local_d0;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8 [4];
  __shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> local_a8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  undefined1 local_98 [32];
  undefined8 local_78;
  _Alloc_hider a_Stack_70 [3];
  undefined1 auStack_58 [8];
  shared_ptr<kratos::AssignStmt> stmt;
  allocator_type local_31;
  
  pVar3 = correct_port_direction
                    ((port2->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
                     in_RCX->_M_ptr,(Generator *)port1);
  if (((ushort)pVar3 >> 8 & 1) != 0) {
    auStack_58 = (undefined1  [8])0x0;
    stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    if (((ushort)pVar3 & 1) == 0) {
      peVar1 = in_RCX->_M_ptr;
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Port,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_78,
                 &port2->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>);
      Var::assign((Var *)local_98,(shared_ptr<kratos::Var> *)peVar1);
    }
    else {
      peVar1 = (port2->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
      std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Port,void>
                ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&local_78,in_RCX);
      Var::assign((Var *)local_98,(shared_ptr<kratos::Var> *)peVar1);
    }
    std::__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)auStack_58,
               (__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)local_98);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_98 + 8));
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)a_Stack_70);
    std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::
    __shared_ptr<kratos::AssignStmt,void>
              (local_a8,(__shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2> *)auStack_58);
    add_stmt((Generator *)port1,(shared_ptr<kratos::Stmt> *)local_a8);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_a0);
    peVar2 = stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    (this->super_IRNode)._vptr_IRNode = (_func_int **)auStack_58;
    stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    (this->super_IRNode).fn_name_ln.
    super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)peVar2;
    auStack_58 = (undefined1  [8])0x0;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
    sVar4.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         extraout_RDX._M_pi;
    sVar4.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this
    ;
    return (shared_ptr<kratos::Stmt>)
           sVar4.super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>;
  }
  this_00 = (VarException *)__cxa_allocate_exception(0x10);
  (*(((port2->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->super_Var).
    super_IRNode._vptr_IRNode[0x1f])(&local_78);
  (*(in_RCX->_M_ptr->super_Var).super_IRNode._vptr_IRNode[0x1f])(local_c8);
  auStack_58 = (undefined1  [8])local_78;
  stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)a_Stack_70[0]._M_p;
  stmt.super___shared_ptr<kratos::AssignStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       local_c8[0];
  bVar5 = fmt::v7::to_string_view<char,_0>
                    (
                    "Cannot wire {0} and {1}. Please make sure they belong to the same module or parent"
                    );
  format_str.data_ = (char *)bVar5.size_;
  format_str.size_ = 0xdd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = in_R9.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)auStack_58;
  fmt::v7::detail::vformat_abi_cxx11_((string *)local_98,(detail *)bVar5.data_,format_str,args);
  local_d8 = (port2->super___shared_ptr<kratos::Port,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_d0 = in_RCX->_M_ptr;
  __l._M_len = 2;
  __l._M_array = (iterator)&local_d8;
  std::vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_>::vector
            ((vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)auStack_58,
             __l,&local_31);
  VarException::VarException
            (this_00,(string *)local_98,
             (vector<const_kratos::IRNode_*,_std::allocator<const_kratos::IRNode_*>_> *)auStack_58);
  __cxa_throw(this_00,&VarException::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::shared_ptr<Stmt> Generator::wire_ports(std::shared_ptr<Port> &port1,
                                            std::shared_ptr<Port> &port2) {
    auto [dir, no_error] = correct_port_direction(port1.get(), port2.get(), this);
    if (!no_error) {
        throw VarException(
            ::format("Cannot wire {0} and {1}. Please make sure they belong to the same module "
                     "or parent",
                     port1->to_string(), port2->to_string()),
            {port1.get(), port2.get()});
    }
    std::shared_ptr<AssignStmt> stmt;
    if (dir)
        stmt = port1->assign(port2);
    else
        stmt = port2->assign(port1);
    add_stmt(stmt);
    return stmt;
}